

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O1

int8_t msocket_unix_listen(msocket_t *self,char *socket_path)

{
  int __fd;
  int iVar1;
  int *piVar2;
  size_t __n;
  char *__dest;
  int sockoptval;
  sockaddr_un saddr;
  undefined4 local_8c;
  sockaddr local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined6 uStack_30;
  undefined2 local_2a;
  undefined6 uStack_28;
  undefined8 uStack_22;
  
  if (self == (msocket_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    local_88.sa_data[6] = '\0';
    local_88.sa_data[7] = '\0';
    local_88.sa_data[8] = '\0';
    local_88.sa_data[9] = '\0';
    local_88.sa_data[10] = '\0';
    local_88.sa_data[0xb] = '\0';
    local_88.sa_data[0xc] = '\0';
    local_88.sa_data[0xd] = '\0';
    uStack_28 = 0;
    uStack_22 = 0;
    uStack_38 = 0;
    uStack_30 = 0;
    local_2a = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    if (*socket_path == '\0') {
      __dest = local_88.sa_data + 1;
      socket_path = socket_path + 1;
      __n = 0x6a;
    }
    else {
      __dest = local_88.sa_data;
      __n = 0x6b;
    }
    local_88.sa_family = 1;
    local_88.sa_data[0] = '\0';
    local_88.sa_data[1] = '\0';
    local_88.sa_data[2] = '\0';
    local_88.sa_data[3] = '\0';
    local_88.sa_data[4] = '\0';
    local_88.sa_data[5] = '\0';
    strncpy(__dest,socket_path,__n);
    __fd = socket(1,1,0);
    if (-1 < __fd) {
      local_8c = 1;
      setsockopt(__fd,1,2,&local_8c,4);
      iVar1 = bind(__fd,&local_88,0x6e);
      if ((-1 < iVar1) && (iVar1 = listen(__fd,5), -1 < iVar1)) {
        self->tcpsockfd = __fd;
        self->state = '\x01';
        self->socketMode = self->socketMode | 2;
        return '\0';
      }
      close(__fd);
      return (int8_t)iVar1;
    }
  }
  return -1;
}

Assistant:

int8_t msocket_unix_listen(msocket_t *self, const char *socket_path)
{
   if(self != 0){

      struct sockaddr_un saddr;
      uint8_t mode = MSOCKET_MODE_TCP; //internally we can act the same way as if this is a TCP socket

      memset(&saddr, 0,sizeof(saddr));
      saddr.sun_family = AF_UNIX;
      if (*socket_path == '\0') {
         *saddr.sun_path = '\0';
         strncpy(saddr.sun_path+1, socket_path+1, sizeof(saddr.sun_path)-2);
      } else {
         strncpy(saddr.sun_path, socket_path, sizeof(saddr.sun_path)-1);
      }
      if (mode == MSOCKET_MODE_TCP){
         int rc;
         SOCKET_T sockunix;
         int sockoptval;
         socklen_t sockoptlen = sizeof(sockoptval);
         sockunix = socket(PF_LOCAL, SOCK_STREAM, 0);
         if(IS_INVALID_SOCKET(sockunix)){
            return -1;
         }
         sockoptval = 1;
         setsockopt(sockunix, SOL_SOCKET, SO_REUSEADDR, (const char*)&sockoptval, sockoptlen);
         rc=bind(sockunix, (struct sockaddr *) &saddr,sizeof(saddr));
         if (rc < 0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         rc = listen(sockunix,5);
         if(rc<0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         self->tcpsockfd = sockunix;
         self->state = MSOCKET_STATE_LISTENING;
         self->socketMode |= mode;
      }
      return 0;
   }
   errno = EINVAL;
   return -1;
}